

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O0

void __thiscall
o3dgc::Vector<unsigned_char>::Allocate(Vector<unsigned_char> *this,unsigned_long size)

{
  uchar *__dest;
  uchar *tmp;
  unsigned_long size_local;
  Vector<unsigned_char> *this_local;
  
  if (this->m_allocated < size) {
    this->m_allocated = size;
    __dest = (uchar *)operator_new__(this->m_allocated);
    if (this->m_size != 0) {
      memcpy(__dest,this->m_buffer,this->m_size);
      if (this->m_buffer != (uchar *)0x0) {
        operator_delete__(this->m_buffer);
      }
    }
    this->m_buffer = __dest;
  }
  return;
}

Assistant:

void                    Allocate(unsigned long size)
                                {
                                    if (size > m_allocated)
                                    {
                                        m_allocated = size;
                                        T * tmp     = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                }